

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::add_quotes_if_needed(string *str)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  char quote;
  string *str_local;
  
  pcVar1 = (char *)::std::__cxx11::string::front();
  if ((*pcVar1 == '\"') || (pcVar1 = (char *)::std::__cxx11::string::front(), *pcVar1 == '\'')) {
    pcVar1 = (char *)::std::__cxx11::string::front();
    cVar3 = *pcVar1;
    pcVar1 = (char *)::std::__cxx11::string::back();
    if (cVar3 == *pcVar1) {
      return str;
    }
  }
  cVar3 = (char)str;
  ::std::__cxx11::string::find(cVar3,0x22);
  ::std::__cxx11::string::find(cVar3,0x27);
  lVar2 = ::std::__cxx11::string::find(cVar3,0x20);
  if (lVar2 != -1) {
    ::std::__cxx11::string::insert((ulong)str,0,'\x01');
    ::std::__cxx11::string::append((ulong)str,'\x01');
  }
  return str;
}

Assistant:

inline std::string &add_quotes_if_needed(std::string &str) {
    if((str.front() != '"' && str.front() != '\'') || str.front() != str.back()) {
        char quote = str.find('"') < str.find('\'') ? '\'' : '"';
        if(str.find(' ') != std::string::npos) {
            str.insert(0, 1, quote);
            str.append(1, quote);
        }
    }
    return str;
}